

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj_test.c
# Opt level: O0

rk_s32 kmpp_obj_by_name_test(char *name,rk_u32 flag)

{
  int local_24;
  long lStack_20;
  MPP_RET ret;
  KmppObj obj;
  char *pcStack_10;
  rk_u32 flag_local;
  char *name_local;
  
  lStack_20 = 0;
  obj._4_4_ = flag;
  pcStack_10 = name;
  local_24 = kmpp_obj_get_by_name(&stack0xffffffffffffffe0,name,"kmpp_obj_by_name_test");
  if (local_24 == 0) {
    if ((obj._4_4_ & 4) != 0) {
      kmpp_obj_udump_f(lStack_20,"kmpp_obj_by_name_test");
    }
    if ((obj._4_4_ & 8) != 0) {
      kmpp_obj_kdump_f(lStack_20,"kmpp_obj_by_name_test");
    }
    local_24 = kmpp_obj_put(lStack_20,"kmpp_obj_by_name_test");
    if (local_24 == 0) {
      lStack_20 = 0;
    }
    else {
      _mpp_log_l(4,"kmpp_obj_test","kmpp_obj_put %s failed\n",0,pcStack_10);
    }
  }
  else {
    _mpp_log_l(4,"kmpp_obj_test","kmpp_obj_get_by_name %s failed ret %d\n",0,pcStack_10,local_24);
  }
  if (lStack_20 != 0) {
    kmpp_obj_put(lStack_20,"kmpp_obj_by_name_test");
  }
  return local_24;
}

Assistant:

static rk_s32 kmpp_obj_by_name_test(const char *name, rk_u32 flag)
{
    KmppObj obj = NULL;
    MPP_RET ret = MPP_NOK;

    ret = kmpp_obj_get_by_name_f(&obj, name);
    if (ret) {
        mpp_log("kmpp_obj_get_by_name %s failed ret %d\n", name, ret);
        goto done;
    }

    if (flag & TEST_OBJ_UDUMP)
        kmpp_obj_udump(obj);
    if (flag & TEST_OBJ_KDUMP)
        kmpp_obj_kdump(obj);

    ret = kmpp_obj_put_f(obj);
    if (ret) {
        mpp_log("kmpp_obj_put %s failed\n", name);
        goto done;
    }
    obj = NULL;

done:
    if (obj)
        kmpp_obj_put_f(obj);

    return ret;
}